

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe57At4(uint8_t *buf)

{
  return ((ulong)(ushort)(*(ushort *)(buf + 5) << 8 | *(ushort *)(buf + 5) >> 8) |
         CONCAT44((uint)buf[2] | (uint)buf[1] << 8 | (uint)*buf << 0x10,
                  (uint)buf[4] << 0x10 | (uint)buf[3] << 0x18) & 0xfffffffffffff) << 5 |
         (ulong)(buf[7] >> 3);
}

Assistant:

std::uint64_t readFlUIntBe57At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[6];
    res <<= 5;
    res |= (buf[7] >> 3);
    res &= UINT64_C(0x1ffffffffffffff);
    return res;
}